

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O2

void amqp_messenger_destroy(AMQP_MESSENGER_HANDLE messenger_handle)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (messenger_handle != (AMQP_MESSENGER_HANDLE)0x0) {
    if (messenger_handle->state != AMQP_MESSENGER_STATE_STOPPED) {
      amqp_messenger_stop(messenger_handle);
    }
    if (messenger_handle->send_queue != (MESSAGE_QUEUE_HANDLE)0x0) {
      message_queue_destroy(messenger_handle->send_queue);
    }
    destroy_configuration(messenger_handle->config);
    free(messenger_handle);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
               ,"amqp_messenger_destroy",0x57d,1,"invalid argument (messenger_handle is NULL)");
    return;
  }
  return;
}

Assistant:

void amqp_messenger_destroy(AMQP_MESSENGER_HANDLE messenger_handle)
{
    if (messenger_handle == NULL)
    {
        LogError("invalid argument (messenger_handle is NULL)");
    }
    else
    {
        AMQP_MESSENGER_INSTANCE* instance = (AMQP_MESSENGER_INSTANCE*)messenger_handle;

        if (instance->state != AMQP_MESSENGER_STATE_STOPPED)
        {
            (void)amqp_messenger_stop(messenger_handle);
        }

        if (instance->send_queue != NULL)
        {
            message_queue_destroy(instance->send_queue);
        }

        destroy_configuration(instance->config);

        free((void*)instance);
    }
}